

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cc
# Opt level: O3

bool __thiscall
flow::lang::Interpreter::compile
          (Interpreter *this,Parser *parser,Report *report,int optimizationLevel)

{
  undefined8 uVar1;
  int iVar2;
  byte bVar3;
  unique_ptr<flow::Program,_std::default_delete<flow::Program>_> program;
  unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_> programIR;
  IRGenerator irgen;
  PassManager pm;
  undefined1 local_5a0 [16];
  pointer local_590;
  string local_588;
  string local_568;
  _Any_data local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  HandlerPass local_4a8;
  HandlerPass local_488;
  HandlerPass local_468;
  HandlerPass local_448;
  HandlerPass local_428;
  HandlerPass local_408;
  HandlerPass local_3e8;
  IRGenerator local_3c8;
  TargetCodeGenerator local_2e8;
  
  Parser::parse((Parser *)&local_590);
  iVar2 = (*report->_vptr_Report[3])(report);
  if ((char)iVar2 == '\0') {
    IRGenerator::IRGenerator(&local_3c8,report);
    IRGenerator::generate((IRGenerator *)(local_5a0 + 8),(UnitSym *)&local_3c8);
    if (0 < optimizationLevel) {
      local_2e8.super_InstructionVisitor._vptr_InstructionVisitor = (_func_int **)&local_2e8;
      local_2e8.errors_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      local_2e8.errors_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_2e8.super_InstructionVisitor._vptr_InstructionVisitor;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4c8,"eliminate-empty-blocks","");
      local_3e8.super__Function_base._M_functor._8_8_ = 0;
      local_3e8.super__Function_base._M_functor._M_unused._M_object =
           transform::emptyBlockElimination;
      local_3e8._M_invoker =
           std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_invoke;
      local_3e8.super__Function_base._M_manager =
           std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_manager
      ;
      PassManager::registerPass((PassManager *)&local_2e8,&local_4c8,&local_3e8);
      if ((pointer)local_3e8.super__Function_base._M_manager != (pointer)0x0) {
        (*local_3e8.super__Function_base._M_manager)(&local_3e8,&local_3e8,3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"eliminate-linear-br","")
      ;
      local_408.super__Function_base._M_functor._8_8_ = 0;
      local_408.super__Function_base._M_functor._M_unused._M_object = transform::eliminateLinearBr;
      local_408._M_invoker =
           std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_invoke;
      local_408.super__Function_base._M_manager =
           std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_manager
      ;
      PassManager::registerPass((PassManager *)&local_2e8,&local_4e8,&local_408);
      if ((pointer)local_408.super__Function_base._M_manager != (pointer)0x0) {
        (*local_408.super__Function_base._M_manager)(&local_408,&local_408,3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
      }
      local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_508,"eliminate-unused-blocks","");
      local_428.super__Function_base._M_functor._8_8_ = 0;
      local_428.super__Function_base._M_functor._M_unused._M_object =
           transform::eliminateUnusedBlocks;
      local_428._M_invoker =
           std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_invoke;
      local_428.super__Function_base._M_manager =
           std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_manager
      ;
      PassManager::registerPass((PassManager *)&local_2e8,&local_508,&local_428);
      if ((pointer)local_428.super__Function_base._M_manager != (pointer)0x0) {
        (*local_428.super__Function_base._M_manager)(&local_428,&local_428,3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_dataplus._M_p != &local_508.field_2) {
        operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
      }
      local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_528,"eliminate-unused-instr","");
      local_448.super__Function_base._M_functor._8_8_ = 0;
      local_448.super__Function_base._M_functor._M_unused._M_object =
           transform::eliminateUnusedInstr;
      local_448._M_invoker =
           std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_invoke;
      local_448.super__Function_base._M_manager =
           std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_manager
      ;
      PassManager::registerPass((PassManager *)&local_2e8,&local_528,&local_448);
      if (local_448.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_448.super__Function_base._M_manager)
                  ((_Any_data *)&local_448,(_Any_data *)&local_448,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_dataplus._M_p != &local_528.field_2) {
        operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
      }
      local_548._M_unused._M_object = &local_538;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_548,"fold-constant-condbr","");
      local_468.super__Function_base._M_functor._8_8_ = 0;
      local_468.super__Function_base._M_functor._M_unused._M_object = transform::foldConstantCondBr;
      local_468._M_invoker =
           std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_invoke;
      local_468.super__Function_base._M_manager =
           std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_manager
      ;
      PassManager::registerPass((PassManager *)&local_2e8,(string *)&local_548,&local_468);
      if ((_Elt_pointer)local_468.super__Function_base._M_manager != (_Elt_pointer)0x0) {
        (*local_468.super__Function_base._M_manager)(&local_468,&local_468,3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_unused._0_8_ != &local_538) {
        operator_delete(local_548._M_unused._M_object,(ulong)(local_538._M_allocated_capacity + 1));
      }
      local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"rewrite-br-to-exit","");
      local_488.super__Function_base._M_functor._8_8_ = 0;
      local_488.super__Function_base._M_functor._M_unused._M_object = transform::rewriteBrToExit;
      local_488._M_invoker =
           std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_invoke;
      local_488.super__Function_base._M_manager =
           std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_manager
      ;
      PassManager::registerPass((PassManager *)&local_2e8,&local_568,&local_488);
      if ((_Elt_pointer)local_488.super__Function_base._M_manager != (_Elt_pointer)0x0) {
        (*local_488.super__Function_base._M_manager)(&local_488,&local_488,3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_568._M_dataplus._M_p != &local_568.field_2) {
        operator_delete(local_568._M_dataplus._M_p,
                        (ulong)(local_568.field_2._M_allocated_capacity + 1));
      }
      local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_588,"rewrite-cond-br-to-same-branches","");
      local_4a8.super__Function_base._M_functor._8_8_ = 0;
      local_4a8.super__Function_base._M_functor._M_unused._M_object =
           transform::rewriteCondBrToSameBranches;
      local_4a8._M_invoker =
           std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_invoke;
      local_4a8.super__Function_base._M_manager =
           std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_manager
      ;
      PassManager::registerPass((PassManager *)&local_2e8,&local_588,&local_4a8);
      if ((_Elt_pointer)local_4a8.super__Function_base._M_manager != (_Elt_pointer)0x0) {
        (*local_4a8.super__Function_base._M_manager)(&local_4a8,&local_4a8,3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._M_dataplus._M_p != &local_588.field_2) {
        operator_delete(local_588._M_dataplus._M_p,
                        (ulong)(local_588.field_2._M_allocated_capacity + 1));
      }
      PassManager::run((PassManager *)&local_2e8,(IRProgram *)local_5a0._8_8_);
      std::__cxx11::
      _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
      ::_M_clear((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                  *)&local_2e8);
    }
    uVar1 = local_5a0._8_8_;
    local_5a0._8_8_ = (IRProgram *)0x0;
    std::__uniq_ptr_impl<flow::IRProgram,_std::default_delete<flow::IRProgram>_>::reset
              ((__uniq_ptr_impl<flow::IRProgram,_std::default_delete<flow::IRProgram>_> *)
               &this->programIR_,(pointer)uVar1);
    TargetCodeGenerator::TargetCodeGenerator(&local_2e8);
    TargetCodeGenerator::generate((TargetCodeGenerator *)local_5a0,(IRProgram *)&local_2e8);
    TargetCodeGenerator::~TargetCodeGenerator(&local_2e8);
    Program::link((Program *)local_5a0._0_8_,(char *)this,(char *)report);
    iVar2 = (*report->_vptr_Report[3])(report);
    uVar1 = local_5a0._0_8_;
    if ((byte)iVar2 == 0) {
      local_5a0._0_8_ = (__uniq_ptr_impl<flow::Program,_std::default_delete<flow::Program>_>)0x0;
      std::__uniq_ptr_impl<flow::Program,_std::default_delete<flow::Program>_>::reset
                ((__uniq_ptr_impl<flow::Program,_std::default_delete<flow::Program>_> *)
                 &this->program_,(pointer)uVar1);
      this->initialized_ = false;
    }
    std::unique_ptr<flow::Program,_std::default_delete<flow::Program>_>::~unique_ptr
              ((unique_ptr<flow::Program,_std::default_delete<flow::Program>_> *)local_5a0);
    std::unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_>::~unique_ptr
              ((unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_> *)(local_5a0 + 8)
              );
    local_3c8.super_ASTVisitor._vptr_ASTVisitor = (_func_int **)&PTR__IRGenerator_0019ad58;
    std::_Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>::
    ~_Deque_base(&local_3c8.handlerStack_.
                  super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                );
    if (local_3c8.scope_._M_t.
        super___uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
        ._M_t.
        super__Tuple_impl<0UL,_flow::lang::IRGenerator::Scope_*,_std::default_delete<flow::lang::IRGenerator::Scope>_>
        .super__Head_base<0UL,_flow::lang::IRGenerator::Scope_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
         )0x0) {
      std::
      _Hashtable<flow::lang::Symbol_*,_std::pair<flow::lang::Symbol_*const,_std::__cxx11::list<flow::Value_*,_std::allocator<flow::Value_*>_>_>,_std::allocator<std::pair<flow::lang::Symbol_*const,_std::__cxx11::list<flow::Value_*,_std::allocator<flow::Value_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<flow::lang::Symbol_*>,_std::hash<flow::lang::Symbol_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<flow::lang::Symbol_*,_std::pair<flow::lang::Symbol_*const,_std::__cxx11::list<flow::Value_*,_std::allocator<flow::Value_*>_>_>,_std::allocator<std::pair<flow::lang::Symbol_*const,_std::__cxx11::list<flow::Value_*,_std::allocator<flow::Value_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<flow::lang::Symbol_*>,_std::hash<flow::lang::Symbol_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)((long)local_3c8.scope_._M_t.
                              super___uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_flow::lang::IRGenerator::Scope_*,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                              .super__Head_base<0UL,_flow::lang::IRGenerator::Scope_*,_false>.
                              _M_head_impl + 0x38));
      std::
      _Hashtable<flow::lang::Symbol_*,_std::pair<flow::lang::Symbol_*const,_flow::Value_*>,_std::allocator<std::pair<flow::lang::Symbol_*const,_flow::Value_*>_>,_std::__detail::_Select1st,_std::equal_to<flow::lang::Symbol_*>,_std::hash<flow::lang::Symbol_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<flow::lang::Symbol_*,_std::pair<flow::lang::Symbol_*const,_flow::Value_*>,_std::allocator<std::pair<flow::lang::Symbol_*const,_flow::Value_*>_>,_std::__detail::_Select1st,_std::equal_to<flow::lang::Symbol_*>,_std::hash<flow::lang::Symbol_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_3c8.scope_._M_t.
                       super___uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_flow::lang::IRGenerator::Scope_*,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                       .super__Head_base<0UL,_flow::lang::IRGenerator::Scope_*,_false>._M_head_impl)
      ;
      operator_delete((void *)local_3c8.scope_._M_t.
                              super___uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_flow::lang::IRGenerator::Scope_*,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                              .super__Head_base<0UL,_flow::lang::IRGenerator::Scope_*,_false>.
                              _M_head_impl,0x70);
    }
    bVar3 = (byte)iVar2 ^ 1;
    local_3c8.scope_._M_t.
    super___uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
    ._M_t.
    super__Tuple_impl<0UL,_flow::lang::IRGenerator::Scope_*,_std::default_delete<flow::lang::IRGenerator::Scope>_>
    .super__Head_base<0UL,_flow::lang::IRGenerator::Scope_*,_false>._M_head_impl =
         (__uniq_ptr_data<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>,_true,_true>
          )(__uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
            )0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3c8.exports_);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_3c8.super_IRBuilder.nameStore_._M_h);
  }
  else {
    bVar3 = 0;
  }
  if (local_590 != (pointer)0x0) {
    (**(code **)((local_590->_M_dataplus)._M_p + 8))();
  }
  return (bool)bVar3;
}

Assistant:

bool Interpreter::compile(Parser&& parser,
                          diagnostics::Report* report,
                          int optimizationLevel) {
  std::unique_ptr<flow::lang::UnitSym> unit = parser.parse();

  if (report->containsFailures())
    return false;

  IRGenerator irgen{report};
  std::unique_ptr<IRProgram> programIR = irgen.generate(unit.get());

  if (optimizationLevel > 0) {
    flow::PassManager pm;

    // mandatory passes
    pm.registerPass("eliminate-empty-blocks", &transform::emptyBlockElimination);

    // optional passes
    if (optimizationLevel >= 1) {
      pm.registerPass("eliminate-linear-br", &transform::eliminateLinearBr);
      pm.registerPass("eliminate-unused-blocks", &transform::eliminateUnusedBlocks);
      pm.registerPass("eliminate-unused-instr", &transform::eliminateUnusedInstr);
      pm.registerPass("fold-constant-condbr", &transform::foldConstantCondBr);
      pm.registerPass("rewrite-br-to-exit", &transform::rewriteBrToExit);
      pm.registerPass("rewrite-cond-br-to-same-branches", &transform::rewriteCondBrToSameBranches);
    }

    pm.run(programIR.get());
  }

  programIR_ = std::move(programIR);

  std::unique_ptr<Program> program = TargetCodeGenerator().generate(programIR_.get());
  program->link(this, report);
  if (report->containsFailures())
    return false;

  program_ = std::move(program);
  initialized_ = false;
  return true;
}